

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O0

void (anonymous_namespace)::
     print<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
               (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                *begin,__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                       *end)

{
  bool bVar1;
  int *piVar2;
  pointer pMVar3;
  ostream *poVar4;
  undefined8 *in_RDI;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  i_1;
  int p;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  i;
  int parts;
  ostream *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  ostream *in_stack_ffffffffffffffb8;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  local_38;
  int local_2c;
  MultiViewChannelName *local_28;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  local_20;
  int local_14 [3];
  undefined8 *local_8;
  
  local_14[0] = 1;
  local_20._M_current = (MultiViewChannelName *)*in_RDI;
  local_8 = in_RDI;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pMVar3 = __gnu_cxx::
             __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
             ::operator->(&local_20);
    piVar2 = std::max<int>(&pMVar3->part_number,local_14);
    local_14[0] = *piVar2;
    local_28 = (MultiViewChannelName *)
               __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator++((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                             *)in_stack_ffffffffffffffb8,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  for (local_2c = 0; local_2c < local_14[0]; local_2c = local_2c + 1) {
    local_38._M_current = (MultiViewChannelName *)*local_8;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      pMVar3 = __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator->(&local_38);
      if (pMVar3->part_number == local_2c) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(&local_38);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,pMVar3->part_number);
        in_stack_ffffffffffffffa8 = std::operator<<(poVar4,' ');
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(&local_38);
        poVar4 = std::operator<<(in_stack_ffffffffffffffa8,(string *)pMVar3);
        in_stack_ffffffffffffffb0 = std::operator<<(poVar4," in ");
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(&local_38);
        poVar4 = std::operator<<(in_stack_ffffffffffffffb0,(string *)&pMVar3->view);
        poVar4 = std::operator<<(poVar4,' ');
        in_stack_ffffffffffffffb8 = std::operator<<(poVar4,' ');
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(&local_38);
        poVar4 = std::operator<<(in_stack_ffffffffffffffb8,(string *)&pMVar3->internal_name);
        std::operator<<(poVar4,"\n");
      }
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator++((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                    *)in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
  }
  return;
}

Assistant:

void
print (const T& begin, const T& end)
{
    int parts = 1;
    for (T i = begin; i != end; i++)
    {
        parts = max (i->part_number, parts);
    }

    for (int p = 0; p < parts; p++)
    {
        for (T i = begin; i != end; i++)
        {
            if (i->part_number == p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}